

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

QHash<int,_QVariant> __thiscall
QList<QHash<int,_QVariant>_>::value(QList<QHash<int,_QVariant>_> *this,qsizetype i)

{
  Data *pDVar1;
  QHash<int,_QVariant> *pQVar2;
  ulong in_RDX;
  long in_FS_OFFSET;
  QHash<int,_QVariant> local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.d = (Data *)0x0;
  pQVar2 = (QHash<int,_QVariant> *)(in_RDX * 8 + *(long *)(i + 8));
  if (*(ulong *)(i + 0x10) <= in_RDX) {
    pQVar2 = &local_18;
  }
  pDVar1 = *(Data **)pQVar2;
  (this->d).d = pDVar1;
  if ((pDVar1 != (Data *)0x0) &&
     ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != -1)) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QHash<int,_QVariant>::~QHash(&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (QHash<int,_QVariant>)(Data *)this;
  }
  __stack_chk_fail();
}

Assistant:

T value(qsizetype i) const { return value(i, T()); }